

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O1

void __thiscall BamTools::RuleParser::~RuleParser(RuleParser *this)

{
  pointer pcVar1;
  
  std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::~deque
            (&(this->m_operatorStack).c);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&(this->m_ruleQueue).c);
  pcVar1 = (this->m_ruleString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_ruleString).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~RuleParser() {}